

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool pbrt::Quadratic(float a,float b,float c,float *t0,float *t1)

{
  float __x;
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar6 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 extraout_var [60];
  
  auVar7._4_60_ = in_register_00001284;
  auVar7._0_4_ = c;
  auVar6._4_60_ = in_register_00001244;
  auVar6._0_4_ = b;
  auVar5 = auVar6._0_16_;
  auVar8 = ZEXT416((uint)(a * 4.0 * c));
  auVar1 = vfmsub213ss_fma(auVar5,auVar5,auVar8);
  auVar8 = vfnmadd213ss_fma(ZEXT416((uint)(a * 4.0)),auVar7._0_16_,auVar8);
  __x = auVar1._0_4_ + auVar8._0_4_;
  if (0.0 <= __x) {
    if (__x < 0.0) {
      auVar4._0_4_ = sqrtf(__x);
      auVar4._4_60_ = extraout_var;
      auVar1 = auVar4._0_16_;
    }
    else {
      auVar1 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    }
    if ((a != 0.0) || (NAN(a))) {
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar1 = vpternlogd_avx512vl(auVar1,auVar5,auVar8,0xe4);
      fVar2 = (auVar1._0_4_ + b) * -0.5;
      fVar3 = c / fVar2;
      *t0 = fVar2 / a;
      *t1 = fVar3;
      fVar2 = *t0;
      if (fVar3 < fVar2) {
        *t0 = fVar3;
        *t1 = fVar2;
      }
    }
    else {
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      auVar1 = vxorps_avx512vl(auVar7._0_16_,auVar1);
      fVar2 = auVar1._0_4_ / b;
      *t1 = fVar2;
      *t0 = fVar2;
    }
  }
  return 0.0 <= __x;
}

Assistant:

PBRT_CPU_GPU
inline bool Quadratic(float a, float b, float c, float *t0, float *t1) {
    // Find quadratic discriminant
    float discrim = DifferenceOfProducts(b, b, 4 * a, c);
    if (discrim < 0)
        return false;
    float rootDiscrim = std::sqrt(discrim);

    if (a == 0) {
        *t0 = *t1 = -c / b;
        return true;
    }

    // Compute quadratic _t_ values
    float q = -0.5f * (b + std::copysign(rootDiscrim, b));
    *t0 = q / a;
    *t1 = c / q;
    if (*t0 > *t1)
        pstd::swap(*t0, *t1);
    return true;
}